

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O2

Continue __thiscall anon_unknown.dwarf_12986::Result::Func1(Result *this,string_view arg)

{
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string local_30 [32];
  
  local_40._M_str = arg._M_str;
  local_40._M_len = arg._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_30,&local_40,&local_41);
  std::__cxx11::string::operator=((string *)&this->Func1_,local_30);
  std::__cxx11::string::~string(local_30);
  return No;
}

Assistant:

ArgumentParser::Continue Func1(cm::string_view arg)
  {
    Func1_ = std::string(arg);
    return ArgumentParser::Continue::No;
  }